

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::setTxStatus(CommsInterface *this,ConnectionStatus status)

{
  ConnectionStatus CVar1;
  ConnectionStatus in_ESI;
  TriggerVariable *in_RDI;
  ConnectionStatus in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  CVar1 = std::atomic::operator_cast_to_ConnectionStatus
                    ((atomic<helics::CommsInterface::ConnectionStatus> *)0x4cbcf3);
  if (CVar1 != in_ESI) {
    if (in_ESI == CONNECTED) {
      CVar1 = std::atomic::operator_cast_to_ConnectionStatus
                        ((atomic<helics::CommsInterface::ConnectionStatus> *)0x4cbd36);
      if (CVar1 == STARTUP) {
        std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                  ((atomic<helics::CommsInterface::ConnectionStatus> *)
                   CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
        gmlc::concurrency::TriggerVariable::activate(in_RDI);
      }
    }
    else if ((in_ESI == TERMINATED) || (in_ESI == ERRORED)) {
      CVar1 = std::atomic::operator_cast_to_ConnectionStatus
                        ((atomic<helics::CommsInterface::ConnectionStatus> *)0x4cbd77);
      if (CVar1 == STARTUP) {
        std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                  ((atomic<helics::CommsInterface::ConnectionStatus> *)
                   CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
        gmlc::concurrency::TriggerVariable::activate(in_RDI);
        gmlc::concurrency::TriggerVariable::trigger(in_RDI);
      }
      else {
        std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                  ((atomic<helics::CommsInterface::ConnectionStatus> *)
                   CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
        gmlc::concurrency::TriggerVariable::trigger(in_RDI);
      }
    }
    else {
      std::atomic<helics::CommsInterface::ConnectionStatus>::operator=
                ((atomic<helics::CommsInterface::ConnectionStatus> *)
                 CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void CommsInterface::setTxStatus(ConnectionStatus status)
{
    if (txStatus == status) {
        return;
    }
    switch (status) {
        case ConnectionStatus::CONNECTED:
            if (txStatus == ConnectionStatus::STARTUP) {
                txStatus = status;
                txTrigger.activate();
            }
            break;
        case ConnectionStatus::TERMINATED:
        case ConnectionStatus::ERRORED:
            if (txStatus == ConnectionStatus::STARTUP) {
                txStatus = status;
                txTrigger.activate();
                txTrigger.trigger();
            } else {
                txStatus = status;
                txTrigger.trigger();
            }
            break;
        default:
            txStatus = status;
    }
}